

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.h
# Opt level: O1

bool __thiscall
crnlib::mip_level::unflip
          (mip_level *this,bool allow_unpacking_to_flip,bool uncook_if_necessary_to_unpack)

{
  bool bVar1;
  
  if (this->m_pImage == (image_u8 *)0x0 && this->m_pDXTImage == (dxt_image *)0x0) {
    return false;
  }
  if ((this->m_orient_flags & (cOrientationFlagYFlipped|cOrientationFlagXFlipped)) ==
      cDefaultOrientationFlags) {
    return false;
  }
  if (this->m_pDXTImage != (dxt_image *)0x0) {
    bVar1 = can_unflip_without_unpacking(this);
    if (bVar1) {
      if ((this->m_orient_flags & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
        dxt_image::flip_x(this->m_pDXTImage);
        *(undefined1 *)&this->m_orient_flags = (char)this->m_orient_flags & 0xfe;
      }
      if ((this->m_orient_flags & cOrientationFlagYFlipped) == cDefaultOrientationFlags) {
        return true;
      }
      dxt_image::flip_y(this->m_pDXTImage);
      goto LAB_0012d424;
    }
    if (!allow_unpacking_to_flip) {
      return false;
    }
  }
  unpack_from_dxt(this,false);
  if ((this->m_orient_flags & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
    image<crnlib::color_quad<unsigned_char,_int>_>::flip_x(this->m_pImage);
    *(undefined1 *)&this->m_orient_flags = (char)this->m_orient_flags & 0xfe;
  }
  if ((this->m_orient_flags & cOrientationFlagYFlipped) == cDefaultOrientationFlags) {
    return true;
  }
  image<crnlib::color_quad<unsigned_char,_int>_>::flip_y(this->m_pImage);
LAB_0012d424:
  *(undefined1 *)&this->m_orient_flags = (char)this->m_orient_flags & 0xfd;
  return true;
}

Assistant:

inline bool is_valid() const { return (m_pImage != nullptr) || (m_pDXTImage != nullptr); }